

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

bool accelerator_start_where_proc(Am_Object *inter,Am_Object *event_window,Am_Input_Char ic)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value_00;
  Am_Object cmd;
  Am_Object local_50;
  Am_Value value;
  Am_Value_List accel_list;
  Am_Value_List local_28;
  
  Am_Value_List::Am_Value_List(&accel_list);
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(event_window,0x1e3,1);
  Am_Value::operator=(&value,pAVar2);
  bVar1 = Am_Value::Valid(&value);
  if (bVar1) {
    bVar1 = Am_Value_List::Test(&value);
    if (bVar1) {
      Am_Value_List::operator=(&accel_list,&value);
      Am_Value_List::Am_Value_List(&local_28,&accel_list);
      Am_Object::Am_Object(&local_50,event_window);
      accel_match((Am_Value_List *)&cmd,SUB84(&local_28,0),(Am_Object *)(ulong)(uint)ic);
      Am_Object::~Am_Object(&local_50);
      Am_Value_List::~Am_Value_List(&local_28);
      bVar1 = Am_Object::Valid(&cmd);
      if (bVar1) {
        pAVar2 = Am_Object::Get(&cmd,0xcc,0);
        bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
        if (bVar1) {
          value_00 = Am_Object::operator_cast_to_Am_Wrapper_(&cmd);
          Am_Object::Set(inter,0x152,value_00,1);
          Am_Object::~Am_Object(&cmd);
          bVar1 = true;
          goto LAB_002605ec;
        }
      }
      Am_Object::~Am_Object(&cmd);
    }
  }
  bVar1 = false;
LAB_002605ec:
  Am_Value::~Am_Value(&value);
  Am_Value_List::~Am_Value_List(&accel_list);
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Event_Method, bool, accelerator_start_where,
                 (Am_Object inter, Am_Object event_window, Am_Input_Char ic))
{
  Am_INTER_TRACE_PRINT(inter, "testing " << ic << " as accelerator for "
                                         << event_window);
  Am_Value_List accel_list;
  Am_Value value;
  value = event_window.Peek(Am_ACCELERATOR_LIST);
  if (value.Valid() && Am_Value_List::Test(value)) {
    accel_list = value;
    Am_Object cmd = accel_match(accel_list, ic, event_window);
    if (cmd.Valid()) {
      Am_INTER_TRACE_PRINT(inter, "Found accelerator " << cmd);
      if ((bool)cmd.Get(Am_ACTIVE)) {
        inter.Set(Am_ACCELERATOR, cmd, Am_OK_IF_NOT_THERE);
        return true;
      } else {
        Am_INTER_TRACE_PRINT(inter, "-> but not active");
      }
    }
  }
  //if get here, then fail
  return false;
}